

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

uhugeint_t __thiscall duckdb::Value::GetValueInternal<duckdb::uhugeint_t>(Value *this)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  string *psVar3;
  NotImplementedException *this_00;
  InternalException *pIVar4;
  uint64_t in_RDX;
  uhugeint_t uVar5;
  hugeint_t input;
  interval_t input_00;
  LogicalType local_a0;
  Value local_88;
  string local_48;
  anon_union_16_2_67f50693_for_value local_28;
  
  if (this->is_null == true) {
    pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,"Calling GetValueInternal on a value that is NULL",
               (allocator *)&local_a0);
    InternalException::InternalException(pIVar4,(string *)&local_88);
    __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LVar1 = (this->type_).id_;
  switch(LVar1) {
  case BOOLEAN:
    uVar5 = Cast::Operation<bool,duckdb::uhugeint_t>((this->value_).boolean);
    return uVar5;
  case TINYINT:
    uVar5 = Cast::Operation<signed_char,duckdb::uhugeint_t>((this->value_).tinyint);
    return uVar5;
  case SMALLINT:
    uVar5 = Cast::Operation<short,duckdb::uhugeint_t>((this->value_).smallint);
    return uVar5;
  case INTEGER:
    uVar5 = Cast::Operation<int,duckdb::uhugeint_t>((this->value_).integer);
    return uVar5;
  case BIGINT:
    uVar5 = Cast::Operation<long,duckdb::uhugeint_t>((this->value_).bigint);
    return uVar5;
  case DATE:
    uVar5 = Cast::Operation<duckdb::date_t,duckdb::uhugeint_t>((date_t)(this->value_).date.days);
    return uVar5;
  case TIME:
    uVar5 = Cast::Operation<duckdb::dtime_t,duckdb::uhugeint_t>((dtime_t)(this->value_).time.micros)
    ;
    return uVar5;
  case TIMESTAMP_SEC:
    uVar5 = Cast::Operation<duckdb::timestamp_sec_t,duckdb::uhugeint_t>
                      ((timestamp_sec_t)(this->value_).timestamp_s.super_timestamp_t.value);
    return uVar5;
  case TIMESTAMP_MS:
    uVar5 = Cast::Operation<duckdb::timestamp_ms_t,duckdb::uhugeint_t>
                      ((timestamp_ms_t)(this->value_).timestamp_ms.super_timestamp_t.value);
    return uVar5;
  case TIMESTAMP:
    uVar5 = Cast::Operation<duckdb::timestamp_t,duckdb::uhugeint_t>
                      ((timestamp_t)(this->value_).timestamp.value);
    return uVar5;
  case TIMESTAMP_NS:
    uVar5 = Cast::Operation<duckdb::timestamp_ns_t,duckdb::uhugeint_t>
                      ((timestamp_ns_t)(this->value_).timestamp_ns.super_timestamp_t.value);
    return uVar5;
  case DECIMAL:
    LogicalType::LogicalType(&local_a0,DOUBLE);
    DefaultCastAs(&local_88,this,&local_a0,false);
    uVar5 = GetValueInternal<duckdb::uhugeint_t>(&local_88);
    ~Value(&local_88);
    LogicalType::~LogicalType(&local_a0);
    break;
  case FLOAT:
    uVar5 = Cast::Operation<float,duckdb::uhugeint_t>((this->value_).float_);
    return uVar5;
  case DOUBLE:
    uVar5 = Cast::Operation<double,duckdb::uhugeint_t>((this->value_).double_);
    return uVar5;
  case VARCHAR:
    psVar3 = StringValue::Get_abi_cxx11_(this);
    string_t::string_t((string_t *)&local_28.pointer,(psVar3->_M_dataplus)._M_p);
    uVar5 = Cast::Operation<duckdb::string_t,duckdb::uhugeint_t>((string_t)local_28);
    break;
  case INTERVAL:
    input_00.micros = in_RDX;
    input_00._0_8_ = (this->value_).hugeint.upper;
    uVar5 = Cast::Operation<duckdb::interval_t,duckdb::uhugeint_t>
                      ((Cast *)(this->value_).bigint,input_00);
    return uVar5;
  case UTINYINT:
switchD_012c241d_caseD_1c:
    uVar5 = Cast::Operation<unsigned_char,duckdb::uhugeint_t>((this->value_).utinyint);
    return uVar5;
  case USMALLINT:
switchD_012c241d_caseD_1d:
    uVar5 = Cast::Operation<unsigned_short,duckdb::uhugeint_t>((this->value_).usmallint);
    return uVar5;
  case UINTEGER:
switchD_012c241d_caseD_1e:
    uVar5 = Cast::Operation<unsigned_int,duckdb::uhugeint_t>((this->value_).uinteger);
    return uVar5;
  case UBIGINT:
    uVar5 = Cast::Operation<unsigned_long,duckdb::uhugeint_t>((this->value_).ubigint);
    return uVar5;
  case TIMESTAMP_TZ:
    uVar5 = Cast::Operation<duckdb::timestamp_tz_t,duckdb::uhugeint_t>
                      ((timestamp_tz_t)(this->value_).timestamp_tz.super_timestamp_t.value);
    return uVar5;
  case TIME_TZ:
    uVar5 = Cast::Operation<duckdb::dtime_tz_t,duckdb::uhugeint_t>
                      ((dtime_tz_t)(this->value_).timetz.bits);
    return uVar5;
  case UHUGEINT:
    uVar5.upper = in_RDX;
    uVar5.lower = (this->value_).hugeint.upper;
    uVar5 = Cast::Operation<duckdb::uhugeint_t,duckdb::uhugeint_t>
                      ((Cast *)(this->value_).bigint,uVar5);
    return uVar5;
  case HUGEINT:
  case UUID:
    input.upper = in_RDX;
    input.lower = (this->value_).hugeint.upper;
    uVar5 = Cast::Operation<duckdb::hugeint_t,duckdb::uhugeint_t>
                      ((Cast *)(this->value_).bigint,input);
    return uVar5;
  default:
    if (LVar1 == ENUM) {
      PVar2 = (this->type_).physical_type_;
      if (PVar2 == UINT32) goto switchD_012c241d_caseD_1e;
      if (PVar2 == UINT16) goto switchD_012c241d_caseD_1d;
      if (PVar2 != UINT8) {
        pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_88,"Invalid Internal Type for ENUMs",(allocator *)&local_a0);
        InternalException::InternalException(pIVar4,(string *)&local_88);
        __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto switchD_012c241d_caseD_1c;
    }
  case CHAR:
  case BLOB:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,"Unimplemented type \"%s\" for GetValue()",(allocator *)&local_a0
              );
    LogicalType::ToString_abi_cxx11_(&local_48,&this->type_);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_00,(string *)&local_88,&local_48);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return uVar5;
}

Assistant:

T Value::GetValueInternal() const {
	if (IsNull()) {
		throw InternalException("Calling GetValueInternal on a value that is NULL");
	}
	switch (type_.id()) {
	case LogicalTypeId::BOOLEAN:
		return Cast::Operation<bool, T>(value_.boolean);
	case LogicalTypeId::TINYINT:
		return Cast::Operation<int8_t, T>(value_.tinyint);
	case LogicalTypeId::SMALLINT:
		return Cast::Operation<int16_t, T>(value_.smallint);
	case LogicalTypeId::INTEGER:
		return Cast::Operation<int32_t, T>(value_.integer);
	case LogicalTypeId::BIGINT:
		return Cast::Operation<int64_t, T>(value_.bigint);
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return Cast::Operation<hugeint_t, T>(value_.hugeint);
	case LogicalTypeId::UHUGEINT:
		return Cast::Operation<uhugeint_t, T>(value_.uhugeint);
	case LogicalTypeId::DATE:
		return Cast::Operation<date_t, T>(value_.date);
	case LogicalTypeId::TIME:
		return Cast::Operation<dtime_t, T>(value_.time);
	case LogicalTypeId::TIME_TZ:
		return Cast::Operation<dtime_tz_t, T>(value_.timetz);
	case LogicalTypeId::TIMESTAMP:
		return Cast::Operation<timestamp_t, T>(value_.timestamp);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Cast::Operation<timestamp_sec_t, T>(value_.timestamp_s);
	case LogicalTypeId::TIMESTAMP_MS:
		return Cast::Operation<timestamp_ms_t, T>(value_.timestamp_ms);
	case LogicalTypeId::TIMESTAMP_NS:
		return Cast::Operation<timestamp_ns_t, T>(value_.timestamp_ns);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Cast::Operation<timestamp_tz_t, T>(value_.timestamp_tz);
	case LogicalTypeId::UTINYINT:
		return Cast::Operation<uint8_t, T>(value_.utinyint);
	case LogicalTypeId::USMALLINT:
		return Cast::Operation<uint16_t, T>(value_.usmallint);
	case LogicalTypeId::UINTEGER:
		return Cast::Operation<uint32_t, T>(value_.uinteger);
	case LogicalTypeId::UBIGINT:
		return Cast::Operation<uint64_t, T>(value_.ubigint);
	case LogicalTypeId::FLOAT:
		return Cast::Operation<float, T>(value_.float_);
	case LogicalTypeId::DOUBLE:
		return Cast::Operation<double, T>(value_.double_);
	case LogicalTypeId::VARCHAR:
		return Cast::Operation<string_t, T>(StringValue::Get(*this).c_str());
	case LogicalTypeId::INTERVAL:
		return Cast::Operation<interval_t, T>(value_.interval);
	case LogicalTypeId::DECIMAL:
		return DefaultCastAs(LogicalType::DOUBLE).GetValueInternal<T>();
	case LogicalTypeId::ENUM: {
		switch (type_.InternalType()) {
		case PhysicalType::UINT8:
			return Cast::Operation<uint8_t, T>(value_.utinyint);
		case PhysicalType::UINT16:
			return Cast::Operation<uint16_t, T>(value_.usmallint);
		case PhysicalType::UINT32:
			return Cast::Operation<uint32_t, T>(value_.uinteger);
		default:
			throw InternalException("Invalid Internal Type for ENUMs");
		}
	}
	default:
		throw NotImplementedException("Unimplemented type \"%s\" for GetValue()", type_.ToString());
	}
}